

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindAllExtensionNumbers
          (MergedDescriptorDatabase *this,StringViewArg extendee_type,
          vector<int,_std::allocator<int>_> *output)

{
  bool bVar1;
  uint uVar2;
  reference ppDVar3;
  reference piVar4;
  reference piVar5;
  iterator iVar6;
  int local_10c;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
  *pbStack_108;
  int r_1;
  int local_100;
  undefined1 local_f8 [8];
  iterator __end2_1;
  undefined1 local_d8 [8];
  iterator __begin2_1;
  btree_set<int,_std::less<int>,_std::allocator<int>_> *__range2_1;
  int local_a4;
  iterator iStack_a0;
  int r;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  DescriptorDatabase *source;
  iterator __end2;
  iterator __begin2;
  vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
  *__range2;
  undefined1 local_50 [7];
  bool success;
  vector<int,_std::allocator<int>_> results;
  btree_set<int,_std::less<int>,_std::allocator<int>_> merged_results;
  vector<int,_std::allocator<int>_> *output_local;
  StringViewArg extendee_type_local;
  MergedDescriptorDatabase *this_local;
  
  absl::lts_20250127::btree_set<int,_std::less<int>,_std::allocator<int>_>::btree_set
            ((btree_set<int,_std::less<int>,_std::allocator<int>_> *)
             &results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_50);
  __range2._7_1_ = false;
  __end2 = std::
           vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
           ::begin(&this->sources_);
  source = (DescriptorDatabase *)
           std::
           vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
           ::end(&this->sources_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<google::protobuf::DescriptorDatabase_**,_std::vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>_>
                                     *)&source), bVar1) {
    ppDVar3 = __gnu_cxx::
              __normal_iterator<google::protobuf::DescriptorDatabase_**,_std::vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>_>
              ::operator*(&__end2);
    uVar2 = (*(*ppDVar3)->_vptr_DescriptorDatabase[5])(*ppDVar3,extendee_type,local_50);
    if ((uVar2 & 1) != 0) {
      __end4 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)local_50);
      iStack_a0 = std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)local_50);
      while (bVar1 = __gnu_cxx::operator!=(&__end4,&stack0xffffffffffffff60), bVar1) {
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end4);
        local_a4 = *piVar4;
        absl::lts_20250127::container_internal::
        btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
        ::insert((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>,_bool>
                  *)&__range2_1,
                 (btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                  *)&results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,&local_a4);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end4);
      }
      __range2._7_1_ = true;
    }
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)local_50);
    __gnu_cxx::
    __normal_iterator<google::protobuf::DescriptorDatabase_**,_std::vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>_>
    ::operator++(&__end2);
  }
  __begin2_1._8_8_ =
       &results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  iVar6 = absl::lts_20250127::container_internal::
          btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
          ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                   *)__begin2_1._8_8_);
  __end2_1._8_8_ = iVar6.node_;
  __begin2_1.node_._0_4_ = iVar6.position_;
  local_d8 = (undefined1  [8])__end2_1._8_8_;
  iVar6 = absl::lts_20250127::container_internal::
          btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
          ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                 *)__begin2_1._8_8_);
  pbStack_108 = iVar6.node_;
  local_100 = iVar6.position_;
  local_f8 = (undefined1  [8])pbStack_108;
  __end2_1.node_._0_4_ = local_100;
  while (bVar1 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                 ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                               *)local_d8,(iterator *)local_f8), bVar1) {
    piVar5 = absl::lts_20250127::container_internal::
             btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
             ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                          *)local_d8);
    local_10c = *piVar5;
    std::vector<int,_std::allocator<int>_>::push_back(output,&local_10c);
    absl::lts_20250127::container_internal::
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
    ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                  *)local_d8);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  absl::lts_20250127::btree_set<int,_std::less<int>,_std::allocator<int>_>::~btree_set
            ((btree_set<int,_std::less<int>,_std::allocator<int>_> *)
             &results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return __range2._7_1_;
}

Assistant:

bool MergedDescriptorDatabase::FindAllExtensionNumbers(
    StringViewArg extendee_type, std::vector<int>* output) {
  // NOLINTNEXTLINE(google3-runtime-rename-unnecessary-ordering)
  absl::btree_set<int> merged_results;
  std::vector<int> results;
  bool success = false;
  for (DescriptorDatabase* source : sources_) {
    if (source->FindAllExtensionNumbers(extendee_type, &results)) {
      for (int r : results) merged_results.insert(r);
      success = true;
    }
    results.clear();
  }
  for (int r : merged_results) output->push_back(r);
  return success;
}